

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool google::protobuf::anon_unknown_1::RetrieveOptions
               (int depth,Message *options,DescriptorPool *pool,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  byte bVar1;
  Descriptor *pDVar2;
  FileDescriptor *this;
  DescriptorPool *pDVar3;
  Message *pMVar4;
  DescriptorPool *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000c0;
  Message *in_stack_000000c8;
  int in_stack_000000d4;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
  dynamic_options;
  DynamicMessageFactory factory;
  Descriptor *option_descriptor;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  LogMessage *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  DescriptorPool *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  DynamicMessageFactory *this_00;
  string local_a8 [48];
  DynamicMessageFactory local_78;
  Descriptor *local_28;
  DescriptorPool *local_18;
  bool local_1;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_18 = in_RDX;
  pDVar2 = Message::GetDescriptor((Message *)in_stack_fffffffffffffeb0);
  this = Descriptor::file(pDVar2);
  pDVar3 = FileDescriptor::pool(this);
  if (pDVar3 == local_18) {
    local_1 = RetrieveOptionsAssumingRightPool
                        (in_stack_000000d4,in_stack_000000c8,in_stack_000000c0);
  }
  else {
    pDVar2 = Message::GetDescriptor((Message *)in_stack_fffffffffffffeb0);
    Descriptor::full_name_abi_cxx11_(pDVar2);
    local_28 = DescriptorPool::FindMessageTypeByName
                         (in_stack_fffffffffffffed0,
                          (string *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    if (local_28 == (Descriptor *)0x0) {
      local_1 = RetrieveOptionsAssumingRightPool
                          (in_stack_000000d4,in_stack_000000c8,in_stack_000000c0);
    }
    else {
      DynamicMessageFactory::DynamicMessageFactory
                ((DynamicMessageFactory *)in_stack_fffffffffffffed0);
      pMVar4 = DynamicMessageFactory::GetPrototype
                         ((DynamicMessageFactory *)in_stack_fffffffffffffed0,
                          (Descriptor *)
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      (*(pMVar4->super_MessageLite)._vptr_MessageLite[3])();
      this_00 = &local_78;
      std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
      unique_ptr<std::default_delete<google::protobuf::Message>,void>
                ((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                  *)in_stack_fffffffffffffeb0,
                 (pointer)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
      operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                  *)0x4d0e54);
      MessageLite::SerializeAsString_abi_cxx11_
                ((MessageLite *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      bVar1 = MessageLite::ParseFromString
                        ((MessageLite *)in_stack_fffffffffffffeb0,
                         (string *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      std::__cxx11::string::~string(local_a8);
      if ((bVar1 & 1) == 0) {
        internal::LogMessage::LogMessage
                  (in_stack_fffffffffffffec0,level,(char *)in_stack_fffffffffffffeb0,
                   in_stack_fffffffffffffeac);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffeb0,
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        pDVar2 = Message::GetDescriptor((Message *)in_stack_fffffffffffffeb0);
        Descriptor::full_name_abi_cxx11_(pDVar2);
        in_stack_fffffffffffffeb0 =
             internal::LogMessage::operator<<
                       (in_stack_fffffffffffffeb0,
                        (string *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_fffffffffffffeb0,
                   (LogMessage *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        internal::LogMessage::~LogMessage((LogMessage *)0x4d0fd4);
        local_1 = RetrieveOptionsAssumingRightPool
                            (in_stack_000000d4,in_stack_000000c8,in_stack_000000c0);
      }
      else {
        std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
        ::operator*((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                     *)in_stack_fffffffffffffeb0);
        local_1 = RetrieveOptionsAssumingRightPool
                            (in_stack_000000d4,in_stack_000000c8,in_stack_000000c0);
      }
      std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
      ~unique_ptr((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                   *)in_stack_fffffffffffffeb0);
      DynamicMessageFactory::~DynamicMessageFactory(this_00);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool RetrieveOptions(int depth, const Message& options,
                     const DescriptorPool* pool,
                     std::vector<std::string>* option_entries) {
  // When printing custom options for a descriptor, we must use an options
  // message built on top of the same DescriptorPool where the descriptor
  // is coming from. This is to ensure we are interpreting custom options
  // against the right pool.
  if (options.GetDescriptor()->file()->pool() == pool) {
    return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
  } else {
    const Descriptor* option_descriptor =
        pool->FindMessageTypeByName(options.GetDescriptor()->full_name());
    if (option_descriptor == nullptr) {
      // descriptor.proto is not in the pool. This means no custom options are
      // used so we are safe to proceed with the compiled options message type.
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_options(
        factory.GetPrototype(option_descriptor)->New());
    if (dynamic_options->ParseFromString(options.SerializeAsString())) {
      return RetrieveOptionsAssumingRightPool(depth, *dynamic_options,
                                              option_entries);
    } else {
      GOOGLE_LOG(ERROR) << "Found invalid proto option data for: "
                 << options.GetDescriptor()->full_name();
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
  }
}